

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_send_serial_query(rtr_socket *rtr_socket)

{
  int iVar1;
  long in_FS_OFFSET;
  rtr_socket *rtr_socket_local;
  undefined4 local_18;
  pdu_serial_query pdu;
  
  pdu._4_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  rtr_socket_local._4_1_ = (undefined1)rtr_socket->version;
  rtr_socket_local._5_1_ = 1;
  rtr_socket_local._6_2_ = (undefined2)rtr_socket->session_id;
  local_18 = 0xc;
  pdu._0_4_ = rtr_socket->serial_number;
  lrtr_dbg("RTR Socket: sending serial query, SN: %u",(ulong)rtr_socket->serial_number);
  iVar1 = rtr_send_pdu(rtr_socket,(void *)((long)&rtr_socket_local + 4),0xc);
  if (iVar1 == 0) {
    rtr_socket_local._0_4_ = 0;
  }
  else {
    rtr_change_socket_state(rtr_socket,RTR_ERROR_TRANSPORT);
    rtr_socket_local._0_4_ = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == pdu._4_8_) {
    return (int)rtr_socket_local;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_send_serial_query(struct rtr_socket *rtr_socket)
{
	struct pdu_serial_query pdu;

	pdu.ver = rtr_socket->version;
	pdu.type = SERIAL_QUERY;
	pdu.session_id = rtr_socket->session_id;
	pdu.len = sizeof(pdu);
	pdu.sn = rtr_socket->serial_number;

	RTR_DBG("sending serial query, SN: %u", rtr_socket->serial_number);
	if (rtr_send_pdu(rtr_socket, &pdu, sizeof(pdu)) != RTR_SUCCESS) {
		rtr_change_socket_state(rtr_socket, RTR_ERROR_TRANSPORT);
		return RTR_ERROR;
	}
	return RTR_SUCCESS;
}